

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O1

void websocket_optimize4broadcasts(intptr_t type,int enable)

{
  long lVar1;
  long *plVar2;
  fio_msg_metadata_fn callback;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  timespec tStack_28;
  
  if (type + 0x22U < 3) {
    plVar2 = (long *)(&_DYNAMIC[9].d_val)[type];
    callback = (fio_msg_metadata_fn)(&_DYNAMIC[0xb].d_tag)[type];
    if (enable == 0) {
      LOCK();
      *plVar2 = *plVar2 + -1;
      UNLOCK();
      if (*plVar2 == 0) {
        if (callback != (fio_msg_metadata_fn)0x0) {
          LOCK();
          UNLOCK();
          tStack_28.tv_sec = CONCAT71(tStack_28.tv_sec._1_7_,fio_postoffice.meta.lock);
          while (fio_postoffice.meta.lock != '\0') {
            fio_postoffice.meta.lock = '\x01';
            tStack_28.tv_sec = 0;
            tStack_28.tv_nsec = 1;
            nanosleep(&tStack_28,(timespec *)0x0);
            LOCK();
            UNLOCK();
            tStack_28.tv_sec = CONCAT71(tStack_28.tv_sec._1_7_,fio_postoffice.meta.lock);
          }
          fio_postoffice.meta.lock = '\x01';
          uVar3 = fio_postoffice.meta.ary.end - fio_postoffice.meta.ary.start;
          uVar4 = 0xffffffffffffffff;
          if (uVar3 != 0) {
            uVar5 = fio_postoffice.meta.ary.start;
            uVar4 = fio_postoffice.meta.ary.start;
            if (fio_postoffice.meta.ary.start <= fio_postoffice.meta.ary.end && uVar3 != 0) {
              do {
                uVar5 = uVar4;
                if (fio_postoffice.meta.ary.arry[uVar4] == callback) break;
                uVar4 = uVar4 + 1;
                uVar5 = fio_postoffice.meta.ary.end;
              } while (fio_postoffice.meta.ary.end != uVar4);
            }
            uVar4 = 0xffffffffffffffff;
            if (uVar5 != fio_postoffice.meta.ary.end) {
              uVar4 = uVar5 - fio_postoffice.meta.ary.start;
            }
          }
          if (uVar4 != 0xffffffffffffffff) {
            uVar5 = uVar4;
            if ((long)uVar4 < 0) {
              uVar5 = uVar4 + uVar3;
              if ((long)(uVar4 + uVar3) < 1) {
                uVar5 = 0;
              }
            }
            if (uVar5 < uVar3) {
              if (uVar5 == 0) {
                fio_postoffice.meta.ary.start = fio_postoffice.meta.ary.start + 1;
              }
              else {
                uVar5 = uVar5 + fio_postoffice.meta.ary.start;
                fio_postoffice.meta.ary.end = fio_postoffice.meta.ary.end - 1;
                if (uVar5 <= fio_postoffice.meta.ary.end && fio_postoffice.meta.ary.end - uVar5 != 0
                   ) {
                  memmove(fio_postoffice.meta.ary.arry + uVar5,
                          fio_postoffice.meta.ary.arry + uVar5 + 1,
                          (fio_postoffice.meta.ary.end - uVar5) * 8);
                }
              }
            }
          }
          LOCK();
          fio_postoffice.meta.lock = '\0';
          UNLOCK();
        }
        return;
      }
    }
    else {
      LOCK();
      lVar1 = *plVar2;
      *plVar2 = *plVar2 + 1;
      UNLOCK();
      if (lVar1 == 0) {
        fio_message_metadata_callback_set(callback,1);
        return;
      }
    }
  }
  return;
}

Assistant:

void websocket_optimize4broadcasts(intptr_t type, int enable) {
  static intptr_t generic = 0;
  static intptr_t text = 0;
  static intptr_t binary = 0;
  fio_msg_metadata_s (*callback)(fio_str_info_s, fio_str_info_s, uint8_t);
  intptr_t *counter;
  switch ((0 - type)) {
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB):
    counter = &generic;
    callback = websocket_optimize_generic;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_TEXT):
    counter = &text;
    callback = websocket_optimize_text;
    break;
  case (0 - WEBSOCKET_OPTIMIZE_PUBSUB_BINARY):
    counter = &binary;
    callback = websocket_optimize_binary;
    break;
  default:
    return;
  }
  if (enable) {
    if (fio_atomic_add(counter, 1) == 1) {
      fio_message_metadata_callback_set(callback, 1);
    }
  } else {
    if (fio_atomic_sub(counter, 1) == 0) {
      fio_message_metadata_callback_set(callback, 0);
    }
  }
}